

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O1

void __thiscall
TEST_MockReturnValueTest_WhenALongIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
::testBody(TEST_MockReturnValueTest_WhenALongIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  undefined4 extraout_var_00;
  undefined8 uVar4;
  TestTerminator *pTVar5;
  undefined4 extraout_var_01;
  SimpleString local_30;
  SimpleString local_20;
  
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_20);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xd8))
            ((long *)CONCAT44(extraout_var,iVar1),0xb6cfe);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_30);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_20);
  uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xe8))
                    ((long *)CONCAT44(extraout_var_00,iVar1),0xb6cfd);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0xb6cfe,uVar4,
             "LONGS_EQUAL(expected_return_value, mock().actualCall(\"foo\").returnLongIntValueOrDefault(default_return_value)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x113,pTVar5);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_30);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[0xf])(pMVar2,0xb6cfd);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0xb6cfe,CONCAT44(extraout_var_01,iVar1),
             "LONGS_EQUAL(expected_return_value, mock().returnLongIntValueOrDefault(default_return_value)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x114,pTVar5);
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenALongIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault)
{
    long int default_return_value = 748797;
    long int expected_return_value = default_return_value + 1;
    mock().expectOneCall("foo").andReturnValue(expected_return_value);
    LONGS_EQUAL(expected_return_value, mock().actualCall("foo").returnLongIntValueOrDefault(default_return_value));
    LONGS_EQUAL(expected_return_value, mock().returnLongIntValueOrDefault(default_return_value));
}